

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_602a57::HandleRealPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  bool bVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  size_type sVar6;
  cmArgumentParser<Arguments> *pcVar7;
  cmMakefile *pcVar8;
  string *__u;
  const_reference pvVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_base;
  PolicyID id;
  static_string_view sVar13;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  string oldPolicyPath;
  string realPath;
  anon_class_96_1_9c44fff6 computeNewPath;
  PolicyStatus policyStatus;
  bool use152New;
  bool warnAbout152;
  string home;
  value_type input;
  string local_1a0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_180;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_170;
  undefined1 local_160 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  cmArgumentParser<Arguments> local_c8;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar6 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"REAL_PATH requires a path and an output variable",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00454193;
  }
  if (((anonymous_namespace)::
       HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_c8);
    sVar13 = ::cm::operator____s("BASE_DIRECTORY",0xe);
    pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::optional<std::__cxx11::string>>
                       ((cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                         *)&local_c8,sVar13,0x30);
    sVar13 = ::cm::operator____s("EXPAND_TILDE",0xc);
    pcVar7 = cmArgumentParser<Arguments>::Bind<bool>(pcVar7,sVar13,0x58);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleRealPathCommand::parser,pcVar7);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_c8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleRealPathCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.ExpandTilde);
  local_180 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
  local_170 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_180,3);
  cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_160,
             (cmArgumentParser<(anonymous_namespace)::HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleRealPathCommand::parser,&local_170,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.ExpandTilde,0);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.ExpandTilde);
  pcVar2 = local_20;
  if (bVar3) {
    pcVar8 = cmExecutionStatus::GetMakefile(local_20);
    bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_160,pcVar8);
    if (bVar3) {
      args_local._7_1_ = 1;
      input.field_2._8_4_ = 1;
    }
    else {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
      if (!bVar3) {
        pcVar8 = cmExecutionStatus::GetMakefile(local_20);
        __u = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)
                   &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,__u);
      }
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      std::__cxx11::string::string((string *)(home.field_2._M_local_buf + 8),(string *)pvVar9);
      if ((arguments.BaseDirectory.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged & 1U) != 0) {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)((long)&home.field_2 + 8));
          if (*pcVar11 == '~') {
            lVar12 = std::__cxx11::string::length();
            if (lVar12 != 1) {
              pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)((long)&home.field_2 + 8));
              if (*pcVar11 != '/') goto LAB_00453dfd;
            }
            std::__cxx11::string::string((string *)&policyStatus);
            bVar3 = cmsys::SystemTools::GetEnv("HOME",(string *)&policyStatus);
            if (bVar3) {
              std::__cxx11::string::replace((ulong)((long)&home.field_2 + 8),0,(string *)0x1);
            }
            std::__cxx11::string::~string((string *)&policyStatus);
          }
        }
      }
LAB_00453dfd:
      bVar1 = false;
      bVar3 = true;
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      PVar5 = cmMakefile::GetPolicyStatus(pcVar8,CMP0152,false);
      if (PVar5 == OLD) {
        bVar3 = false;
        bVar1 = false;
      }
      else if (PVar5 == WARN) {
        bVar3 = false;
        bVar1 = true;
      }
      HandleRealPathCommand::Arguments::Arguments
                ((Arguments *)((long)&realPath.field_2 + 8),(Arguments *)local_160);
      std::__cxx11::string::string((string *)(oldPolicyPath.field_2._M_local_buf + 8));
      if (bVar3) {
        HandleRealPathCommand::anon_class_96_1_9c44fff6::operator()
                  ((anon_class_96_1_9c44fff6 *)((long)&realPath.field_2 + 8),
                   (string *)((long)&home.field_2 + 8),(string *)((long)&oldPolicyPath.field_2 + 8))
        ;
      }
      else {
        in_base = std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count);
        cmsys::SystemTools::CollapseFullPath
                  ((string *)local_290,(string *)((long)&home.field_2 + 8),in_base);
        cmsys::SystemTools::GetRealPath(&local_2b0,(string *)local_290,(string *)0x0);
        std::__cxx11::string::operator=((string *)local_290,(string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        if (bVar1) {
          HandleRealPathCommand::anon_class_96_1_9c44fff6::operator()
                    ((anon_class_96_1_9c44fff6 *)((long)&realPath.field_2 + 8),
                     (string *)((long)&home.field_2 + 8),
                     (string *)((long)&oldPolicyPath.field_2 + 8));
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_290,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&oldPolicyPath.field_2 + 8));
          if (bVar3) {
            pcVar8 = cmExecutionStatus::GetMakefile(local_20);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2f0,(cmPolicies *)0x98,id);
            cmStrCat<std::__cxx11::string,char_const(&)[21],std::__cxx11::string&,char_const(&)[43],std::__cxx11::string&,char_const(&)[47],std::__cxx11::string&,char_const(&)[81]>
                      (&local_2d0,&local_2f0,(char (*) [21])"\nFrom input path:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&home.field_2 + 8),
                       (char (*) [43])"\nthe policy OLD behavior produces path:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290,(char (*) [47])"\nbut the policy NEW behavior produces path:\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&oldPolicyPath.field_2 + 8),
                       (char (*) [81])
                       "\nSince the policy is not set, CMake is using the OLD behavior for compatibility."
                      );
            cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::__cxx11::string::~string((string *)&local_2f0);
          }
        }
        std::__cxx11::string::operator=
                  ((string *)(oldPolicyPath.field_2._M_local_buf + 8),(string *)local_290);
        std::__cxx11::string::~string((string *)local_290);
      }
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(oldPolicyPath.field_2._M_local_buf + 8));
      cmMakefile::AddDefinition(pcVar8,pvVar9,value);
      args_local._7_1_ = 1;
      input.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)(oldPolicyPath.field_2._M_local_buf + 8));
      (anonymous_namespace)::
      HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::$_0::~__0((__0 *)(realPath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(home.field_2._M_local_buf + 8));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"REAL_PATH called with unexpected arguments",
               (allocator<char> *)(input.field_2._M_local_buf + 0xf));
    cmExecutionStatus::SetError(pcVar2,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
    args_local._7_1_ = 0;
    input.field_2._8_4_ = 1;
  }
  HandleRealPathCommand::Arguments::~Arguments((Arguments *)local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.ExpandTilde);
LAB_00454193:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRealPathCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("REAL_PATH requires a path and an output variable");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> BaseDirectory;
    bool ExpandTilde = false;
  };
  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("BASE_DIRECTORY"_s, &Arguments::BaseDirectory)
      .Bind("EXPAND_TILDE"_s, &Arguments::ExpandTilde);

  std::vector<std::string> unparsedArguments;
  auto arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unparsedArguments);

  if (!unparsedArguments.empty()) {
    status.SetError("REAL_PATH called with unexpected arguments");
    return false;
  }
  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!arguments.BaseDirectory) {
    arguments.BaseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  auto input = args[1];
  if (arguments.ExpandTilde && !input.empty()) {
    if (input[0] == '~' && (input.length() == 1 || input[1] == '/')) {
      std::string home;
      if (
#if defined(_WIN32) && !defined(__CYGWIN__)
        cmSystemTools::GetEnv("USERPROFILE", home) ||
#endif
        cmSystemTools::GetEnv("HOME", home)) {
        input.replace(0, 1, home);
      }
    }
  }

  bool warnAbout152 = false;
  bool use152New = true;
  cmPolicies::PolicyStatus policyStatus =
    status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0152);
  switch (policyStatus) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
    case cmPolicies::WARN:
      use152New = false;
      warnAbout152 = true;
      break;
    case cmPolicies::OLD:
      use152New = false;
      warnAbout152 = false;
      break;
  }

  auto computeNewPath = [=](std::string const& in, std::string& result) {
    auto path = cmCMakePath{ in };
    if (path.IsRelative()) {
      auto basePath = cmCMakePath{ *arguments.BaseDirectory };
      path = basePath.Append(path);
    }
    result = cmSystemTools::GetActualCaseForPath(
      cmSystemTools::GetRealPath(path.String()));
  };

  std::string realPath;
  if (use152New) {
    computeNewPath(input, realPath);
  } else {
    std::string oldPolicyPath =
      cmSystemTools::CollapseFullPath(input, *arguments.BaseDirectory);
    oldPolicyPath = cmSystemTools::GetRealPath(oldPolicyPath);
    if (warnAbout152) {
      computeNewPath(input, realPath);
      if (oldPolicyPath != realPath) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0152),
                   "\n"
                   "From input path:\n  ",
                   input, "\nthe policy OLD behavior produces path:\n  ",
                   oldPolicyPath,
                   "\nbut the policy NEW behavior produces path:\n  ",
                   realPath,
                   "\nSince the policy is not set, CMake is using the OLD "
                   "behavior for compatibility."));
      }
    }
    realPath = oldPolicyPath;
  }

  status.GetMakefile().AddDefinition(args[2], realPath);

  return true;
}